

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

void testing::Mock::RegisterUseByOnCallOrExpectCall(void *mock_obj,char *file,int line)

{
  char *pcVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  UnitTest *this;
  TestInfo *pTVar4;
  key_type *__k;
  void *local_38;
  void *mock_obj_local;
  
  __k = (key_type *)file;
  local_38 = mock_obj;
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  pmVar3 = std::
           map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
           ::operator[]((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                         *)&local_38,__k);
  if (pmVar3->first_used_file == (char *)0x0) {
    pmVar3->first_used_file = file;
    pmVar3->first_used_line = line;
    this = UnitTest::GetInstance();
    pTVar4 = UnitTest::current_test_info(this);
    if (pTVar4 != (TestInfo *)0x0) {
      pcVar1 = (pTVar4->test_case_name_)._M_dataplus._M_p;
      pcVar2 = (char *)(pmVar3->first_used_test_case)._M_string_length;
      strlen(pcVar1);
      std::__cxx11::string::_M_replace((ulong)&pmVar3->first_used_test_case,0,pcVar2,(ulong)pcVar1);
      pcVar1 = (pTVar4->name_)._M_dataplus._M_p;
      pcVar2 = (char *)(pmVar3->first_used_test)._M_string_length;
      strlen(pcVar1);
      std::__cxx11::string::_M_replace((ulong)&pmVar3->first_used_test,0,pcVar2,(ulong)pcVar1);
    }
  }
  internal::MutexBase::Unlock((MutexBase *)internal::g_gmock_mutex);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  MockObjectState& state = g_mock_object_registry.states()[mock_obj];
  if (state.first_used_file == NULL) {
    state.first_used_file = file;
    state.first_used_line = line;
    const TestInfo* const test_info =
        UnitTest::GetInstance()->current_test_info();
    if (test_info != NULL) {
      // TODO(wan@google.com): record the test case name when the
      // ON_CALL or EXPECT_CALL is invoked from SetUpTestCase() or
      // TearDownTestCase().
      state.first_used_test_case = test_info->test_case_name();
      state.first_used_test = test_info->name();
    }
  }
}